

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn_pacman_agent.hh
# Opt level: O2

void __thiscall NN_Pacman_Agent::NN_Pacman_Agent(NN_Pacman_Agent *this,string *neural_network_path)

{
  uint uVar1;
  ostream *poVar2;
  allocator_type local_e9;
  char str [200];
  
  (this->super_Agent)._vptr_Agent = (_func_int **)&PTR_take_action_0011fd30;
  Neural_Network::Neural_Network(&this->nn,neural_network_path,0.0);
  (this->input).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->input).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->input).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  uVar1 = (this->nn).n_inputs;
  if (uVar1 == RL_Pacman_Agent_Inputs::n_inputs) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)str,(long)(int)uVar1,&local_e9);
    std::vector<double,_std::allocator<double>_>::_M_move_assign
              (&this->input,(_Vector_base<double,_std::allocator<double>_> *)str);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)str);
    return;
  }
  builtin_strncpy(str,"This neural network was trained with different inputs",0x36);
  poVar2 = std::operator<<((ostream *)&std::cout,"Error[");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/agents/pacman/rl/nn_pacman_agent.hh"
                          );
  poVar2 = std::operator<<(poVar2,"][");
  poVar2 = std::operator<<(poVar2,"NN_Pacman_Agent");
  poVar2 = std::operator<<(poVar2,"][Line ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x1a);
  poVar2 = std::operator<<(poVar2,"] ");
  poVar2 = std::operator<<(poVar2,str);
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(1);
}

Assistant:

NN_Pacman_Agent(string neural_network_path) : nn(neural_network_path, 0.0) {
        ensure(nn.n_inputs == uint(RL_Pacman_Agent_Inputs::n_inputs), "This neural network was trained with different inputs");
        input = vector<double>(RL_Pacman_Agent_Inputs::n_inputs);
    }